

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O2

bool __thiscall
Lib::Set<Kernel::OperatorType*,Kernel::OperatorType::TypeHash>::find<Kernel::OperatorType*>
          (Set<Kernel::OperatorType*,Kernel::OperatorType::TypeHash> *this,OperatorType *key,
          OperatorType **result)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  int *piVar6;
  
  uVar3 = Kernel::OperatorType::TypeHash::hash(key);
  uVar5 = 2;
  if (2 < uVar3) {
    uVar5 = (ulong)uVar3;
  }
  piVar4 = *(int **)(this + 0x10);
  piVar6 = piVar4 + (uVar5 % (ulong)*(uint *)this) * 4;
  do {
    iVar1 = *piVar6;
    if (iVar1 == 0) {
LAB_0044bc43:
      return iVar1 != 0;
    }
    if (iVar1 == (int)uVar5) {
      bVar2 = Kernel::OperatorType::operator==(*(OperatorType **)(piVar6 + 2),key);
      if (bVar2) {
        *result = *(OperatorType **)(piVar6 + 2);
        goto LAB_0044bc43;
      }
      piVar4 = *(int **)(this + 0x10);
    }
    piVar6 = piVar6 + 4;
    if (piVar6 == *(int **)(this + 0x18)) {
      piVar6 = piVar4;
    }
  } while( true );
}

Assistant:

bool find(Key key, Val& result) const
  {
    unsigned code = Hash::hash(key);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,key)) {
	result=cell->value;
	return true;
      }
    }
    return false;
  }